

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O0

int Lodtalk::ScriptContext::stAddMethod(InterpreterProxy *interpreter)

{
  Node *ast_00;
  MethodDictionary *this;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  anon_union_8_4_0eb573b0_for_Oop_0 aVar3;
  undefined4 extraout_var_02;
  CompiledMethod *pCVar4;
  Oop key;
  ClassDescription *pCVar5;
  Oop value;
  Oop selector;
  undefined1 local_148 [8];
  Ref<Lodtalk::CompiledMethod> compiledMethod;
  shared_ptr<Lodtalk::InstanceVariableScope> instanceVarScope;
  shared_ptr<Lodtalk::GlobalEvaluationScope> globalScope;
  MethodAST *ast;
  MethodASTHandle *handle;
  Ref<Lodtalk::ClassDescription> clazz;
  string local_d0;
  anon_union_8_4_0eb573b0_for_Oop_0 local_b0;
  allocator local_a1;
  string local_a0;
  anon_union_8_4_0eb573b0_for_Oop_0 local_80;
  allocator local_61;
  string local_60;
  anon_union_8_4_0eb573b0_for_Oop_0 local_40;
  anon_union_8_4_0eb573b0_for_Oop_0 local_38;
  Oop methodAstHandle;
  ScriptContext *self;
  VMContext *context;
  InterpreterProxy *interpreter_local;
  VMContext *this_00;
  undefined4 extraout_var_01;
  
  iVar2 = (**interpreter->_vptr_InterpreterProxy)();
  this_00 = (VMContext *)CONCAT44(extraout_var,iVar2);
  iVar2 = (*interpreter->_vptr_InterpreterProxy[0x1a])();
  if (CONCAT44(extraout_var_00,iVar2) == 1) {
    aVar3._0_4_ = (*interpreter->_vptr_InterpreterProxy[0xb])();
    aVar3.uintValue._4_4_ = extraout_var_01;
    methodAstHandle.field_0 = aVar3;
    local_40._0_4_ = (*interpreter->_vptr_InterpreterProxy[0x1c])(interpreter,0);
    local_40.uintValue._4_4_ = extraout_var_02;
    local_38 = local_40;
    bVar1 = isNil((Oop)local_40);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_60,"cannot add method with nil ast.",&local_61);
      nativeError(&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      std::allocator<char>::~allocator((allocator<char> *)&local_61);
    }
    local_80 = local_38;
    iVar2 = classIndexOf((Oop)local_38);
    if (iVar2 != 0x66) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_a0,"expected a method AST handle.",&local_a1);
      nativeError(&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_a1);
    }
    local_b0 = *(anon_union_8_4_0eb573b0_for_Oop_0 *)(aVar3.uintValue + 0x10);
    bVar1 = VMContext::isClassOrMetaclass(this_00,(Oop)local_b0);
    if (!bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_d0,"a class is needed for adding a method.",
                 (allocator *)((long)&clazz.reference.nextReference_ + 7));
      nativeError(&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::allocator<char>::~allocator
                ((allocator<char> *)((long)&clazz.reference.nextReference_ + 7));
    }
    Ref<Lodtalk::ClassDescription>::Ref
              ((Ref<Lodtalk::ClassDescription> *)&handle,this_00,
               *(ClassDescription **)(aVar3.uintValue + 0x10));
    ast_00 = *(Node **)(local_38.uintValue + 8);
    std::make_shared<Lodtalk::GlobalEvaluationScope,Lodtalk::VMContext*&>
              ((VMContext **)
               &instanceVarScope.
                super___shared_ptr<Lodtalk::InstanceVariableScope,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::
    make_shared<Lodtalk::InstanceVariableScope,std::shared_ptr<Lodtalk::GlobalEvaluationScope>&,Lodtalk::Ref<Lodtalk::ClassDescription>&>
              ((shared_ptr<Lodtalk::GlobalEvaluationScope> *)
               &compiledMethod.reference.nextReference_,
               (Ref<Lodtalk::ClassDescription> *)
               &instanceVarScope.
                super___shared_ptr<Lodtalk::InstanceVariableScope,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::shared_ptr<Lodtalk::EvaluationScope>::shared_ptr<Lodtalk::InstanceVariableScope,void>
              ((shared_ptr<Lodtalk::EvaluationScope> *)&selector,
               (shared_ptr<Lodtalk::InstanceVariableScope> *)
               &compiledMethod.reference.nextReference_);
    pCVar4 = compileMethod(this_00,(shared_ptr<Lodtalk::EvaluationScope> *)&selector,
                           (Ref<Lodtalk::ClassDescription> *)&handle,ast_00);
    Ref<Lodtalk::CompiledMethod>::Ref((Ref<Lodtalk::CompiledMethod> *)local_148,this_00,pCVar4);
    std::shared_ptr<Lodtalk::EvaluationScope>::~shared_ptr
              ((shared_ptr<Lodtalk::EvaluationScope> *)&selector);
    pCVar4 = Ref<Lodtalk::CompiledMethod>::operator->((Ref<Lodtalk::CompiledMethod> *)local_148);
    key = CompiledMethod::getSelector(pCVar4);
    pCVar5 = Ref<Lodtalk::ClassDescription>::operator->((Ref<Lodtalk::ClassDescription> *)&handle);
    this = (pCVar5->super_Behavior).methodDict;
    value = Ref<Lodtalk::CompiledMethod>::getOop((Ref<Lodtalk::CompiledMethod> *)local_148);
    MethodDictionary::atPut(this,this_00,key,value);
    interpreter_local._4_4_ = (*interpreter->_vptr_InterpreterProxy[0x12])();
    Ref<Lodtalk::CompiledMethod>::~Ref((Ref<Lodtalk::CompiledMethod> *)local_148);
    std::shared_ptr<Lodtalk::InstanceVariableScope>::~shared_ptr
              ((shared_ptr<Lodtalk::InstanceVariableScope> *)
               &compiledMethod.reference.nextReference_);
    std::shared_ptr<Lodtalk::GlobalEvaluationScope>::~shared_ptr
              ((shared_ptr<Lodtalk::GlobalEvaluationScope> *)
               &instanceVarScope.
                super___shared_ptr<Lodtalk::InstanceVariableScope,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    Ref<Lodtalk::ClassDescription>::~Ref((Ref<Lodtalk::ClassDescription> *)&handle);
  }
  else {
    interpreter_local._4_4_ = (*interpreter->_vptr_InterpreterProxy[0x1e])();
  }
  return interpreter_local._4_4_;
}

Assistant:

int ScriptContext::stAddMethod(InterpreterProxy *interpreter)
{
    auto context = interpreter->getContext();
    if(interpreter->getArgumentCount() != 1)
        return interpreter->primitiveFailed();
    auto self = reinterpret_cast<ScriptContext*> (interpreter->getReceiver().pointer);
    auto methodAstHandle = interpreter->getTemporary(0);

	if(isNil(methodAstHandle))
		nativeError("cannot add method with nil ast.");
	if(classIndexOf(methodAstHandle) != SCI_MethodASTHandle)
		nativeError("expected a method AST handle.");

	// Check the class
	if(!context->isClassOrMetaclass(self->currentClass))
		nativeError("a class is needed for adding a method.");
	Ref<ClassDescription> clazz(context, reinterpret_cast<ClassDescription*> (self->currentClass.pointer));

	// Get the ast
	MethodASTHandle *handle = reinterpret_cast<MethodASTHandle*> (methodAstHandle.pointer);
	auto ast = handle->ast;

	// Create the global scope
	auto globalScope = std::make_shared<GlobalEvaluationScope> (context);

	// TODO: Create the class variables scope.

	// Create the class instance variables scope.
	auto instanceVarScope = std::make_shared<InstanceVariableScope> (globalScope, clazz);

	// Compile the method
	Ref<CompiledMethod> compiledMethod(context, compileMethod(context, instanceVarScope, clazz, ast));

	// Register the method in the current class
	auto selector = compiledMethod->getSelector();
	clazz->methodDict->atPut(context, selector, compiledMethod.getOop());

	// Return self
	return interpreter->returnReceiver();
}